

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load_data(segment_impl<ELFIO::Elf64_Phdr> *this)

{
  address_translator *this_00;
  istream *piVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  uint64_t __off;
  undefined4 extraout_var_00;
  size_t sVar6;
  unsigned_long uVar7;
  char *__p;
  pointer pcVar8;
  long *plVar9;
  fpos<__mbstate_t> local_58;
  ulong local_48;
  Elf_Xword size;
  streampos local_30;
  ulong local_20;
  Elf_Xword p_offset;
  segment_impl<ELFIO::Elf64_Phdr> *this_local;
  
  p_offset = (Elf_Xword)this;
  iVar5 = (*(this->super_segment)._vptr_segment[3])();
  if ((iVar5 == 0) ||
     (iVar5 = (*(this->super_segment)._vptr_segment[0xd])(), CONCAT44(extraout_var,iVar5) == 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = this->translator;
    __off = endianness_convertor::operator()(this->convertor,(this->ph).p_offset);
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&size,__off);
    local_30 = address_translator::operator[](this_00,_size);
    local_20 = std::fpos::operator_cast_to_long((fpos *)&local_30);
    iVar5 = (*(this->super_segment)._vptr_segment[0xd])();
    uVar3 = local_20;
    local_48 = CONCAT44(extraout_var_00,iVar5);
    sVar6 = get_stream_size(this);
    uVar2 = local_48;
    if (sVar6 < uVar3) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=(&this->data,(nullptr_t)0x0);
      this_local._7_1_ = false;
    }
    else {
      sVar6 = get_stream_size(this);
      uVar3 = local_48;
      if ((sVar6 < uVar2) ||
         (sVar6 = get_stream_size(this), uVar2 = local_48, sVar6 - local_20 < uVar3)) {
        std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=(&this->data,(nullptr_t)0x0)
        ;
        this_local._7_1_ = false;
      }
      else {
        uVar7 = std::numeric_limits<unsigned_long>::max();
        if (uVar7 - 1 < uVar2) {
          std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
                    (&this->data,(nullptr_t)0x0);
          this_local._7_1_ = false;
        }
        else {
          __p = (char *)operator_new__(local_48 + 1,(nothrow_t *)&std::nothrow);
          std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                    ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data,__p);
          piVar1 = this->pstream;
          std::fpos<__mbstate_t>::fpos(&local_58,local_20);
          std::istream::seekg(piVar1,local_58._M_off,local_58._M_state);
          pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
          if (pcVar8 != (pointer)0x0) {
            piVar1 = this->pstream;
            pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
            plVar9 = (long *)std::istream::read((char *)piVar1,(long)pcVar8);
            bVar4 = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
            if (bVar4) {
              pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
              pcVar8[local_48] = '\0';
              this->is_loaded = true;
              return true;
            }
          }
          std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
                    (&this->data,(nullptr_t)0x0);
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }